

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  bool bVar2;
  Encoding EVar3;
  ostream *poVar4;
  string *psVar5;
  cmGeneratedFileStream *this_01;
  string *psVar6;
  char *pcVar7;
  string local_2b0;
  string dependFileNameFull;
  cmGeneratedFileStream depFileStream;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&depFileStream,"CMAKE_MAKE_INCLUDE_FROM_ROOT",
             (allocator<char> *)&dependFileNameFull);
  bVar2 = cmMakefile::IsOn(this_00,(string *)&depFileStream);
  pcVar7 = "";
  if (bVar2) {
    pcVar7 = "$(CMAKE_BINARY_DIR)/";
  }
  std::__cxx11::string::~string((string *)&depFileStream);
  std::__cxx11::string::string
            ((string *)&dependFileNameFull,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::append((char *)&dependFileNameFull);
  poVar4 = std::operator<<((ostream *)this->BuildFileStream,
                           "# Include any dependencies generated for this target.\n");
  poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar7);
  pcVar1 = this->LocalGenerator;
  psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&local_2b0,(cmLocalGenerator *)pcVar1,psVar5,&dependFileNameFull);
  cmSystemTools::ConvertToOutputPath((string *)&depFileStream,&local_2b0);
  poVar4 = std::operator<<(poVar4,(string *)&depFileStream);
  std::operator<<(poVar4,"\n\n");
  std::__cxx11::string::~string((string *)&depFileStream);
  std::__cxx11::string::~string((string *)&local_2b0);
  if (this->NoRuleMessages == false) {
    poVar4 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the progress variables for this target.\n");
    poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,pcVar7);
    pcVar1 = this->LocalGenerator;
    psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_2b0,(cmLocalGenerator *)pcVar1,psVar5,&this->ProgressFileNameFull);
    cmSystemTools::ConvertToOutputPath((string *)&depFileStream,&local_2b0);
    poVar4 = std::operator<<(poVar4,(string *)&depFileStream);
    std::operator<<(poVar4,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  bVar2 = cmsys::SystemTools::FileExists(&dependFileNameFull);
  if (!bVar2) {
    EVar3 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream(&depFileStream,&dependFileNameFull,false,EVar3);
    poVar4 = std::operator<<((ostream *)&depFileStream,"# Empty dependencies file for ");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<(poVar4,"# This may be replaced when dependencies are built.");
    std::endl<char,std::char_traits<char>>(poVar4);
    cmGeneratedFileStream::~cmGeneratedFileStream(&depFileStream);
  }
  psVar5 = &this->FlagFileNameFull;
  std::__cxx11::string::_M_assign((string *)psVar5);
  std::__cxx11::string::append((char *)psVar5);
  this_01 = (cmGeneratedFileStream *)operator_new(0x248);
  EVar3 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream(this_01,psVar5,false,EVar3);
  this->FlagFileStream = this_01;
  cmGeneratedFileStream::SetCopyIfDifferent(this_01,true);
  if (this->FlagFileStream != (cmGeneratedFileStream *)0x0) {
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,(ostream *)this->FlagFileStream);
    poVar4 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the compile flags for this target\'s objects.\n");
    poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,pcVar7);
    pcVar1 = this->LocalGenerator;
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_2b0,(cmLocalGenerator *)pcVar1,psVar6,psVar5);
    cmSystemTools::ConvertToOutputPath((string *)&depFileStream,&local_2b0);
    poVar4 = std::operator<<(poVar4,(string *)&depFileStream);
    std::operator<<(poVar4,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  std::__cxx11::string::~string((string *)&dependFileNameFull);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                        ? "$(CMAKE_BINARY_DIR)/"
                        : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull = this->TargetBuildDirectoryFull;
  dependFileNameFull += "/depend.make";
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeConvertToRelativePath(
           this->LocalGenerator->GetBinaryDirectory(), dependFileNameFull))
    << "\n\n";

  if (!this->NoRuleMessages) {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator->MaybeConvertToRelativePath(
             this->LocalGenerator->GetBinaryDirectory(),
             this->ProgressFileNameFull))
      << "\n\n";
  }

  // make sure the depend file exists
  if (!cmSystemTools::FileExists(dependFileNameFull)) {
    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(
      dependFileNameFull, false, this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# Empty dependencies file for "
                  << this->GeneratorTarget->GetName() << ".\n"
                  << "# This may be replaced when dependencies are built."
                  << std::endl;
  }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull = this->TargetBuildDirectoryFull;
  this->FlagFileNameFull += "/flags.make";
  this->FlagFileStream =
    new cmGeneratedFileStream(this->FlagFileNameFull, false,
                              this->GlobalGenerator->GetMakefileEncoding());
  this->FlagFileStream->SetCopyIfDifferent(true);
  if (!this->FlagFileStream) {
    return;
  }
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeConvertToRelativePath(
           this->LocalGenerator->GetBinaryDirectory(), this->FlagFileNameFull))
    << "\n\n";
}